

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O3

bool __thiscall
InputSource::findFirst
          (InputSource *this,char *start_chars,qpdf_offset_t offset,size_t len,Finder *finder)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  char *__s1;
  logic_error *this_00;
  long i;
  char *i_00;
  char buf [1025];
  char *local_460;
  char local_438 [1032];
  ulong uVar4;
  
  sVar3 = strlen(start_chars);
  if (sVar3 - 0x401 < 0xfffffffffffffc00) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "InputSource::findSource called with too small or too large of a character sequence")
    ;
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  __s1 = (char *)0x0;
  uVar4 = 0;
  local_460 = (char *)offset;
  do {
    if (__s1 == (char *)0x0) {
LAB_00123b36:
      (*this->_vptr_InputSource[5])(this,local_460,0);
      iVar2 = (*this->_vptr_InputSource[7])(this,local_438,0x400);
      uVar4 = CONCAT44(extraout_var,iVar2);
      sVar3 = strlen(start_chars);
      if (uVar4 < sVar3) {
        return false;
      }
      memset(local_438 + uVar4,0,0x401 - uVar4);
      __s1 = local_438;
    }
    else {
      sVar3 = strlen(start_chars);
      if (local_438 + uVar4 < __s1 + sVar3) {
        local_460 = __s1 + ((long)local_460 - (long)local_438);
        goto LAB_00123b36;
      }
    }
    cVar1 = *start_chars;
    i = (long)__s1 - (long)local_438;
    if (i < 0) {
      QIntC::IntConverter<long,_unsigned_long,_true,_false>::error(i);
    }
    __s1 = (char *)memchr(__s1,(int)cVar1,uVar4 - i);
    if (__s1 == (char *)0x0) {
      __s1 = local_438 + uVar4;
    }
    else {
      if (len != 0) {
        i_00 = __s1 + (long)(local_460 + (-offset - (long)local_438));
        if ((long)i_00 < 0) {
          QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error((longlong)i_00);
        }
        if (len <= i_00) {
          return false;
        }
      }
      sVar3 = strlen(start_chars);
      if (__s1 + sVar3 <= local_438 + uVar4) {
        iVar2 = strncmp(__s1,start_chars,sVar3);
        if (iVar2 == 0) {
          (*this->_vptr_InputSource[5])(this,__s1 + ((long)local_460 - (long)local_438),0);
          iVar2 = (*finder->_vptr_Finder[2])();
          if ((char)iVar2 != '\0') {
            return true;
          }
        }
        __s1 = __s1 + 1;
      }
    }
  } while( true );
}

Assistant:

bool
InputSource::findFirst(char const* start_chars, qpdf_offset_t offset, size_t len, Finder& finder)
{
    // Basic approach: search for the first character of start_chars starting from offset but not
    // going past len (if len != 0). Once the first character is found, see if it is the beginning
    // of a sequence of characters matching start_chars. If so, call finder.check() to do
    // caller-specific additional checks. If not, keep searching.

    // This code is tricky and highly subject to off-by-one or other edge case logic errors. See
    // comments throughout that explain how we're not missing any edge cases. There are also tests
    // specifically constructed to make sure we caught the edge cases in testing.

    char buf[1025]; // size known to input_source.cc in libtests
    // To enable us to guarantee null-termination, save an extra byte so that buf[size] is valid
    // memory.
    size_t size = sizeof(buf) - 1;
    if ((strlen(start_chars) < 1) || (strlen(start_chars) > size)) {
        throw std::logic_error(
            "InputSource::findSource called with too small or too large of a character sequence");
    }

    char* p = nullptr;
    qpdf_offset_t buf_offset = offset;
    size_t bytes_read = 0;

    // Guarantee that we return from this loop. Each time through, we either return, advance p, or
    // restart the loop with a condition that will cause return on the next pass. Eventually we will
    // either be out of range or hit EOF, either of which forces us to return.
    while (true) {
        // Do we need to read more data? Pretend size = 5, buf starts at 0, and start_chars has 3
        // characters. buf[5] is valid and null. If p == 2, start_chars could be buf[2] through
        // buf[4], so p + strlen(start_chars) == buf + size is okay. If p points to buf[size], since
        // strlen(start_chars) is always >= 1, this overflow test will be correct for that case
        // regardless of start_chars.
        if ((p == nullptr) || ((p + strlen(start_chars)) > (buf + bytes_read))) {
            if (p) {
                QTC::TC(
                    "libtests", "InputSource read next block", ((p == buf + bytes_read) ? 0 : 1));
                buf_offset += (p - buf);
            }
            this->seek(buf_offset, SEEK_SET);
            // Read into buffer and zero out the rest of the buffer including buf[size]. We
            // allocated an extra byte so that we could guarantee null termination as an extra
            // protection against overrun when using string functions.
            bytes_read = this->read(buf, size);
            if (bytes_read < strlen(start_chars)) {
                QTC::TC("libtests", "InputSource find EOF", bytes_read == 0 ? 0 : 1);
                return false;
            }
            memset(buf + bytes_read, '\0', 1 + (size - bytes_read));
            p = buf;
        }

        // Search for the first character.
        if ((p = static_cast<char*>(
                 // line-break
                 memchr(p, start_chars[0], bytes_read - QIntC::to_size(p - buf)))) != nullptr) {
            if (p == buf) {
                QTC::TC("libtests", "InputSource found match at buf[0]");
            }
            // Found first letter.
            if (len != 0) {
                // Make sure it's in range.
                size_t p_relative_offset = QIntC::to_size((p - buf) + (buf_offset - offset));
                if (p_relative_offset >= len) {
                    // out of range
                    QTC::TC("libtests", "InputSource out of range");
                    return false;
                }
            }
            if ((p + strlen(start_chars)) > (buf + bytes_read)) {
                // If there are not enough bytes left in the file for start_chars, we will detect
                // this on the next pass as EOF and return.
                QTC::TC("libtests", "InputSource not enough bytes");
                continue;
            }

            // See if p points to a sequence matching start_chars. We already checked above to make
            // sure we are not going to overrun memory.
            if (strncmp(p, start_chars, strlen(start_chars)) == 0) {
                // Call finder.check() with the input source positioned to the point of the match.
                this->seek(buf_offset + (p - buf), SEEK_SET);
                if (finder.check()) {
                    return true;
                } else {
                    QTC::TC("libtests", "InputSource start_chars matched but not check");
                }
            } else {
                QTC::TC("libtests", "InputSource first char matched but not string");
            }
            // This occurrence of the first character wasn't a match. Skip over it and keep
            // searching.
            ++p;
        } else {
            // Trigger reading the next block
            p = buf + bytes_read;
        }
    }
    throw std::logic_error("InputSource after while (true)");
}